

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

boolean exist_artifact(int otyp,char *name)

{
  short sVar1;
  int iVar2;
  short *psVar3;
  boolean *pbVar4;
  
  if (otyp == 0) {
    return '\0';
  }
  if ((*name != '\0') && (sVar1 = artilist[1].otyp, sVar1 != 0)) {
    psVar3 = &artilist[2].otyp;
    pbVar4 = artiexist;
    do {
      pbVar4 = pbVar4 + 1;
      if ((sVar1 == otyp) && (iVar2 = strcmp(*(char **)(psVar3 + -0x3d),name), iVar2 == 0)) {
        return *pbVar4;
      }
      sVar1 = *psVar3;
      psVar3 = psVar3 + 0x20;
    } while (sVar1 != 0);
  }
  return '\0';
}

Assistant:

boolean exist_artifact(int otyp, const char *name)
{
	const struct artifact *a;
	boolean *arex;

	if (otyp && *name)
	    for (a = artilist+1,arex = artiexist+1; a->otyp; a++,arex++)
		if ((int) a->otyp == otyp && !strcmp(a->name, name))
		    return *arex;
	return FALSE;
}